

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_mtree.c
# Opt level: O0

wchar_t process_add_entry(archive_read *a,mtree *mtree,mtree_option **global,char *line,
                         ssize_t line_len,mtree_entry **last_entry,wchar_t is_form_d)

{
  char cVar1;
  int iVar2;
  wchar_t wVar3;
  mtree_entry *mentry;
  int *piVar4;
  char *pcVar5;
  size_t sVar6;
  char *pcVar7;
  archive_rb_node *local_98;
  mtree_entry *alt;
  int local_88;
  char last_character;
  wchar_t i;
  wchar_t r;
  size_t len;
  size_t name_len;
  char *end;
  char *name;
  char *eq;
  char *next;
  mtree_option *iter;
  mtree_entry *entry;
  mtree_entry **last_entry_local;
  ssize_t line_len_local;
  char *line_local;
  mtree_option **global_local;
  mtree *mtree_local;
  archive_read *a_local;
  
  mentry = (mtree_entry *)malloc(0x40);
  if (mentry == (mtree_entry *)0x0) {
    piVar4 = __errno_location();
    archive_set_error(&a->archive,*piVar4,"Can\'t allocate memory");
    a_local._4_4_ = L'\xffffffe2';
  }
  else {
    mentry->next = (mtree_entry *)0x0;
    mentry->options = (mtree_option *)0x0;
    mentry->name = (char *)0x0;
    mentry->used = '\0';
    mentry->full = '\0';
    if (*last_entry == (mtree_entry *)0x0) {
      mtree->entries = mentry;
    }
    else {
      (*last_entry)->next = mentry;
    }
    *last_entry = mentry;
    last_entry_local = (mtree_entry **)line_len;
    end = line;
    if (is_form_d == L'\0') {
      len = strcspn(line," \t\r\n");
      line_len_local = (ssize_t)(line + len);
      name_len = line_len_local + line_len;
    }
    else {
      for (; (0 < (long)last_entry_local &&
             ((((cVar1 = line[(long)last_entry_local + -1], cVar1 == '\r' || (cVar1 == '\n')) ||
               (cVar1 == '\t')) || (cVar1 == ' '))));
          last_entry_local = (mtree_entry **)((long)last_entry_local + -1)) {
      }
      for (local_88 = 0; (long)local_88 < (long)last_entry_local; local_88 = local_88 + 1) {
        if (((line[local_88] == '\r') || (line[local_88] == '\n')) ||
           ((line[local_88] == '\t' || (line[local_88] == ' ')))) {
          end = line + (long)local_88 + 1;
        }
      }
      len = (long)(line + (long)last_entry_local) - (long)end;
      name_len = (size_t)end;
      line_len_local = (ssize_t)line;
    }
    pcVar5 = (char *)malloc(len + 1);
    mentry->name = pcVar5;
    if (pcVar5 == (char *)0x0) {
      piVar4 = __errno_location();
      archive_set_error(&a->archive,*piVar4,"Can\'t allocate memory");
      a_local._4_4_ = L'\xffffffe2';
    }
    else {
      memcpy(mentry->name,end,len);
      mentry->name[len] = '\0';
      parse_escapes(mentry->name,mentry);
      mentry->next_dup = (mtree_entry *)0x0;
      if ((mentry->full != '\0') &&
         (iVar2 = __archive_rb_tree_insert_node(&mtree->rbtree,(archive_rb_node *)mentry),
         iVar2 == 0)) {
        for (local_98 = __archive_rb_tree_find_node(&mtree->rbtree,mentry->name);
            local_98[1].rb_nodes[0] != (archive_rb_node *)0x0; local_98 = local_98[1].rb_nodes[0]) {
        }
        local_98[1].rb_nodes[0] = (archive_rb_node *)mentry;
      }
      for (next = (char *)*global; next != (char *)0x0; next = *(char **)next) {
        pcVar5 = *(char **)(next + 8);
        sVar6 = strlen(*(char **)(next + 8));
        wVar3 = add_option(a,&mentry->options,pcVar5,sVar6);
        if (wVar3 != L'\0') {
          return wVar3;
        }
      }
      do {
        sVar6 = strspn((char *)line_len_local," \t\r\n");
        pcVar5 = (char *)(line_len_local + sVar6);
        if (*pcVar5 == '\0') {
          return L'\0';
        }
        if (name_len <= pcVar5) {
          return L'\0';
        }
        sVar6 = strcspn(pcVar5," \t\r\n");
        line_len_local = (ssize_t)(pcVar5 + sVar6);
        pcVar7 = strchr(pcVar5,0x3d);
        if ((pcVar7 == (char *)0x0) || ((ulong)line_len_local < pcVar7)) {
          _i = line_len_local - (long)pcVar5;
        }
        else {
          _i = (long)pcVar7 - (long)pcVar5;
        }
        remove_option(&mentry->options,pcVar5,_i);
        a_local._4_4_ = add_option(a,&mentry->options,pcVar5,line_len_local - (long)pcVar5);
      } while (a_local._4_4_ == L'\0');
    }
  }
  return a_local._4_4_;
}

Assistant:

static int
process_add_entry(struct archive_read *a, struct mtree *mtree,
    struct mtree_option **global, const char *line, ssize_t line_len,
    struct mtree_entry **last_entry, int is_form_d)
{
	struct mtree_entry *entry;
	struct mtree_option *iter;
	const char *next, *eq, *name, *end;
	size_t name_len, len;
	int r, i;

	if ((entry = malloc(sizeof(*entry))) == NULL) {
		archive_set_error(&a->archive, errno, "Can't allocate memory");
		return (ARCHIVE_FATAL);
	}
	entry->next = NULL;
	entry->options = NULL;
	entry->name = NULL;
	entry->used = 0;
	entry->full = 0;

	/* Add this entry to list. */
	if (*last_entry == NULL)
		mtree->entries = entry;
	else
		(*last_entry)->next = entry;
	*last_entry = entry;

	if (is_form_d) {
		/* Filename is last item on line. */
		/* Adjust line_len to trim trailing whitespace */
		while (line_len > 0) {
			char last_character = line[line_len - 1];
			if (last_character == '\r'
			    || last_character == '\n'
			    || last_character == '\t'
			    || last_character == ' ') {
				line_len--;
			} else {
				break;
			}
		}
		/* Name starts after the last whitespace separator */
		name = line;
		for (i = 0; i < line_len; i++) {
			if (line[i] == '\r'
			    || line[i] == '\n'
			    || line[i] == '\t'
			    || line[i] == ' ') {
				name = line + i + 1;
			}
		}
		name_len = line + line_len - name;
		end = name;
	} else {
		/* Filename is first item on line */
		name_len = strcspn(line, " \t\r\n");
		name = line;
		line += name_len;
		end = line + line_len;
	}
	/* name/name_len is the name within the line. */
	/* line..end brackets the entire line except the name */

	if ((entry->name = malloc(name_len + 1)) == NULL) {
		archive_set_error(&a->archive, errno, "Can't allocate memory");
		return (ARCHIVE_FATAL);
	}

	memcpy(entry->name, name, name_len);
	entry->name[name_len] = '\0';
	parse_escapes(entry->name, entry);

	entry->next_dup = NULL;
	if (entry->full) {
		if (!__archive_rb_tree_insert_node(&mtree->rbtree, &entry->rbnode)) {
			struct mtree_entry *alt;
			alt = (struct mtree_entry *)__archive_rb_tree_find_node(
			    &mtree->rbtree, entry->name);
			while (alt->next_dup)
				alt = alt->next_dup;
			alt->next_dup = entry;
		}
	}

	for (iter = *global; iter != NULL; iter = iter->next) {
		r = add_option(a, &entry->options, iter->value,
		    strlen(iter->value));
		if (r != ARCHIVE_OK)
			return (r);
	}

	for (;;) {
		next = line + strspn(line, " \t\r\n");
		if (*next == '\0')
			return (ARCHIVE_OK);
		if (next >= end)
			return (ARCHIVE_OK);
		line = next;
		next = line + strcspn(line, " \t\r\n");
		eq = strchr(line, '=');
		if (eq == NULL || eq > next)
			len = next - line;
		else
			len = eq - line;

		remove_option(&entry->options, line, len);
		r = add_option(a, &entry->options, line, next - line);
		if (r != ARCHIVE_OK)
			return (r);
		line = next;
	}
}